

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode-vfp-uncond.inc.c
# Opt level: O1

_Bool disas_vfp_uncond(DisasContext_conflict1 *ctx,uint32_t insn)

{
  _Bool _Var1;
  uint uVar2;
  code *pcVar3;
  anon_union_20_4_fa272343 u;
  arg_VSEL local_14;
  
  uVar2 = insn & 0xff800f50;
  if ((int)uVar2 < -0x17ff5c0) {
    if (uVar2 == 0xfe000a00) {
      local_14.vm = (insn >> 5 & 1) + (insn & 0xf) * 2;
      local_14.vn = insn >> 0xf & 0x1e | insn >> 7 & 1;
      local_14.vd = insn >> 0xb & 0x1e | insn >> 0x16 & 1;
      local_14.dp = 0;
    }
    else {
      if (uVar2 != 0xfe000b00) {
        if (uVar2 != 0xfe800a00) {
          return false;
        }
        local_14.dp = (insn >> 5 & 1) + (insn & 0xf) * 2;
        local_14.vd = insn >> 0xf & 0x1e | insn >> 7 & 1;
        local_14.cc = insn >> 0xb & 0x1e | insn >> 0x16 & 1;
        if (((insn & 0x300000) == 0) && ((ctx->isar->mvfr2 & 0xc0) != 0)) {
          pcVar3 = gen_helper_vfp_maxnums;
LAB_00642cb9:
          _Var1 = do_vfp_3op_sp(ctx,pcVar3,local_14.cc,local_14.vd,local_14.dp,false);
          return _Var1;
        }
        goto LAB_00642d76;
      }
      local_14.vm = insn >> 1 & 0x10 | insn & 0xf;
      local_14.vn = insn >> 3 & 0x10 | insn >> 0x10 & 0xf;
      local_14.vd = insn >> 0x12 & 0x10 | insn >> 0xc & 0xf;
      local_14.dp = 1;
    }
    local_14.cc = insn >> 0x14 & 3;
    _Var1 = trans_VSEL(ctx,&local_14);
  }
  else {
    if (uVar2 == 0xfe800a40) {
      uVar2 = insn >> 0x14 & 3;
      if (uVar2 == 3) {
        uVar2 = insn >> 0x12 & 3;
        if (uVar2 == 3) {
          local_14.vn = (insn >> 5 & 1) + (insn & 0xf) * 2;
          local_14.vm = insn >> 0xb & 0x1e | insn >> 0x16 & 1;
          local_14.cc = 0;
LAB_00642f06:
          local_14.vd = insn >> 0x10 & 3;
          local_14.dp = insn >> 7 & 1;
          _Var1 = trans_VCVT(ctx,(arg_VCVT *)&local_14);
          return _Var1;
        }
        if (uVar2 == 2) {
          local_14.vm = (insn >> 5 & 1) + (insn & 0xf) * 2;
          local_14.vd = insn >> 0xb & 0x1e | insn >> 0x16 & 1;
          local_14.cc = 0;
LAB_00642e4e:
          local_14.dp = insn >> 0x10 & 3;
          if (-1 < (char)insn) {
            _Var1 = trans_VRINT(ctx,(arg_VRINT *)&local_14);
            return _Var1;
          }
        }
      }
      else if (uVar2 == 0) {
        local_14.dp = (insn >> 5 & 1) + (insn & 0xf) * 2;
        local_14.vd = insn >> 0xf & 0x1e | insn >> 7 & 1;
        local_14.cc = insn >> 0xb & 0x1e | insn >> 0x16 & 1;
        if ((ctx->isar->mvfr2 & 0xc0) != 0) {
          pcVar3 = gen_helper_vfp_minnums;
          goto LAB_00642cb9;
        }
      }
    }
    else if (uVar2 == 0xfe800b00) {
      local_14.dp = insn >> 1 & 0x10 | insn & 0xf;
      local_14.vd = insn >> 3 & 0x10 | insn >> 0x10 & 0xf;
      local_14.cc = insn >> 0x12 & 0x10 | insn >> 0xc & 0xf;
      if (((insn & 0x300000) == 0) && ((ctx->isar->mvfr2 & 0xc0) != 0)) {
        pcVar3 = gen_helper_vfp_maxnumd;
LAB_00642d8e:
        _Var1 = do_vfp_3op_dp(ctx,pcVar3,local_14.cc,local_14.vd,local_14.dp,false);
        return _Var1;
      }
    }
    else {
      if (uVar2 != 0xfe800b40) {
        return false;
      }
      uVar2 = insn >> 0x14 & 3;
      if (uVar2 == 3) {
        uVar2 = insn >> 0x12 & 3;
        if (uVar2 == 3) {
          local_14.vn = insn >> 1 & 0x10 | insn & 0xf;
          local_14.vm = insn >> 0xb & 0x1e | insn >> 0x16 & 1;
          local_14.cc = 1;
          goto LAB_00642f06;
        }
        if (uVar2 == 2) {
          local_14.vm = insn >> 1 & 0x10 | insn & 0xf;
          local_14.vd = insn >> 0x12 & 0x10 | insn >> 0xc & 0xf;
          local_14.cc = 1;
          goto LAB_00642e4e;
        }
      }
      else if (uVar2 == 0) {
        local_14.dp = insn >> 1 & 0x10 | insn & 0xf;
        local_14.vd = insn >> 3 & 0x10 | insn >> 0x10 & 0xf;
        local_14.cc = insn >> 0x12 & 0x10 | insn >> 0xc & 0xf;
        if ((ctx->isar->mvfr2 & 0xc0) != 0) {
          pcVar3 = gen_helper_vfp_minnumd;
          goto LAB_00642d8e;
        }
      }
    }
LAB_00642d76:
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool disas_vfp_uncond(DisasContext *ctx, uint32_t insn)
{
    union {
        arg_disas_vfp_uncond0 f_disas_vfp_uncond0;
        arg_disas_vfp_uncond1 f_disas_vfp_uncond1;
        arg_disas_vfp_uncond2 f_disas_vfp_uncond2;
        arg_disas_vfp_uncond3 f_disas_vfp_uncond3;
    } u;

    switch (insn & 0xff800f50) {
    case 0xfe000a00:
        /* 11111110 0....... ....1010 .0.0.... */
        /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:47 */
        disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_2(ctx, &u.f_disas_vfp_uncond1, insn);
        if (trans_VSEL(ctx, &u.f_disas_vfp_uncond1)) return true;
        return false;
    case 0xfe000b00:
        /* 11111110 0....... ....1011 .0.0.... */
        /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:49 */
        disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_3(ctx, &u.f_disas_vfp_uncond1, insn);
        if (trans_VSEL(ctx, &u.f_disas_vfp_uncond1)) return true;
        return false;
    case 0xfe800a00:
        /* 11111110 1....... ....1010 .0.0.... */
        disas_vfp_uncond_extract_vfp_dnm_s(ctx, &u.f_disas_vfp_uncond0, insn);
        switch ((insn >> 20) & 0x3) {
        case 0x0:
            /* 11111110 1.00.... ....1010 .0.0.... */
            /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:52 */
            if (trans_VMAXNM_sp(ctx, &u.f_disas_vfp_uncond0)) return true;
            return false;
        }
        return false;
    case 0xfe800a40:
        /* 11111110 1....... ....1010 .1.0.... */
        switch ((insn >> 20) & 0x3) {
        case 0x0:
            /* 11111110 1.00.... ....1010 .1.0.... */
            /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:53 */
            disas_vfp_uncond_extract_vfp_dnm_s(ctx, &u.f_disas_vfp_uncond0, insn);
            if (trans_VMINNM_sp(ctx, &u.f_disas_vfp_uncond0)) return true;
            return false;
        case 0x3:
            /* 11111110 1.11.... ....1010 .1.0.... */
            switch ((insn >> 18) & 0x3) {
            case 0x2:
                /* 11111110 1.1110.. ....1010 .1.0.... */
                disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_4(ctx, &u.f_disas_vfp_uncond2, insn);
                switch ((insn >> 7) & 0x1) {
                case 0x0:
                    /* 11111110 1.1110.. ....1010 01.0.... */
                    /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:58 */
                    if (trans_VRINT(ctx, &u.f_disas_vfp_uncond2)) return true;
                    return false;
                }
                return false;
            case 0x3:
                /* 11111110 1.1111.. ....1010 .1.0.... */
                /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:64 */
                disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_6(ctx, &u.f_disas_vfp_uncond3, insn);
                if (trans_VCVT(ctx, &u.f_disas_vfp_uncond3)) return true;
                return false;
            }
            return false;
        }
        return false;
    case 0xfe800b00:
        /* 11111110 1....... ....1011 .0.0.... */
        disas_vfp_uncond_extract_vfp_dnm_d(ctx, &u.f_disas_vfp_uncond0, insn);
        switch ((insn >> 20) & 0x3) {
        case 0x0:
            /* 11111110 1.00.... ....1011 .0.0.... */
            /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:55 */
            if (trans_VMAXNM_dp(ctx, &u.f_disas_vfp_uncond0)) return true;
            return false;
        }
        return false;
    case 0xfe800b40:
        /* 11111110 1....... ....1011 .1.0.... */
        switch ((insn >> 20) & 0x3) {
        case 0x0:
            /* 11111110 1.00.... ....1011 .1.0.... */
            /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:56 */
            disas_vfp_uncond_extract_vfp_dnm_d(ctx, &u.f_disas_vfp_uncond0, insn);
            if (trans_VMINNM_dp(ctx, &u.f_disas_vfp_uncond0)) return true;
            return false;
        case 0x3:
            /* 11111110 1.11.... ....1011 .1.0.... */
            switch ((insn >> 18) & 0x3) {
            case 0x2:
                /* 11111110 1.1110.. ....1011 .1.0.... */
                disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_5(ctx, &u.f_disas_vfp_uncond2, insn);
                switch ((insn >> 7) & 0x1) {
                case 0x0:
                    /* 11111110 1.1110.. ....1011 01.0.... */
                    /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:60 */
                    if (trans_VRINT(ctx, &u.f_disas_vfp_uncond2)) return true;
                    return false;
                }
                return false;
            case 0x3:
                /* 11111110 1.1111.. ....1011 .1.0.... */
                /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:66 */
                disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_7(ctx, &u.f_disas_vfp_uncond3, insn);
                if (trans_VCVT(ctx, &u.f_disas_vfp_uncond3)) return true;
                return false;
            }
            return false;
        }
        return false;
    }
    return false;
}